

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

ssize_t __thiscall
Dashel::FileDescriptorStream::write(FileDescriptorStream *this,int __fd,void *__buf,size_t __n)

{
  _func_int *p_Var1;
  ssize_t sVar2;
  int *piVar3;
  FileDescriptorStream *extraout_RAX;
  FileDescriptorStream *extraout_RAX_00;
  FileDescriptorStream *pFVar4;
  undefined4 in_register_00000034;
  ssize_t len;
  size_t left;
  char *ptr;
  size_t size_local;
  void *data_local;
  FileDescriptorStream *this_local;
  
  left = CONCAT44(in_register_00000034,__fd);
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x311,
                  "virtual void Dashel::FileDescriptorStream::write(const void *, const size_t)");
  }
  pFVar4 = this;
  len = (ssize_t)__buf;
  if (__buf != (void *)0x0) {
    while (pFVar4 = (FileDescriptorStream *)__buf, len != 0) {
      sVar2 = ::write((this->super_DisconnectableStream).super_SelectableStream.fd,(void *)left,len)
      ;
      if (sVar2 < 0) {
        p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                 [-3];
        piVar3 = __errno_location();
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream + (long)p_Var1),IOError,*piVar3,
                     "File write I/O error.");
        __buf = extraout_RAX;
      }
      else if (sVar2 == 0) {
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),ConnectionLost,0,"File full.");
        __buf = extraout_RAX_00;
      }
      else {
        left = sVar2 + left;
        __buf = (void *)(len - sVar2);
        len = (ssize_t)__buf;
      }
    }
  }
  return (ssize_t)pFVar4;
}

Assistant:

virtual void write(const void* data, const size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

			const char* ptr = (const char*)data;
			size_t left = size;

			while (left)
			{
				ssize_t len = ::write(fd, ptr, left);

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "File write I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "File full.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}